

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::get_hash_for_pipeline_layout
          (StateRecorder *this,VkPipelineLayout layout,Hash *hash)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false> local_30;
  iterator itr;
  Hash *hash_local;
  VkPipelineLayout layout_local;
  StateRecorder *this_local;
  
  if (layout == (VkPipelineLayout)0x0) {
    *hash = 0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>._M_cur
         = (_Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>)
           (_Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>)hash;
    hash_local = (Hash *)layout;
    layout_local = (VkPipelineLayout)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkPipelineLayout_T_*,_unsigned_long,_std::hash<VkPipelineLayout_T_*>,_std::equal_to<VkPipelineLayout_T_*>,_std::allocator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>_>_>
         ::find(&this->impl->pipeline_layout_to_hash,(key_type *)&hash_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkPipelineLayout_T*,unsigned_long,std::hash<VkPipelineLayout_T*>,std::equal_to<VkPipelineLayout_T*>,std::allocator<std::pair<VkPipelineLayout_T*const,unsigned_long>>>>
                   (&this->impl->pipeline_layout_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      log_failed_hash<VkPipelineLayout_T*>("Pipeline layout",(VkPipelineLayout_T *)hash_local);
      this_local._7_1_ = false;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false,_false>::
               operator->((_Node_iterator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false,_false>
                           *)&local_30);
      *(unsigned_long *)
       itr.super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>.
       _M_cur = ppVar2->second;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::get_hash_for_pipeline_layout(VkPipelineLayout layout, Hash *hash) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// Allowed by VK_EXT_graphics_pipeline_library.
		*hash = 0;
		return true;
	}

	auto itr = impl->pipeline_layout_to_hash.find(layout);
	if (itr == end(impl->pipeline_layout_to_hash))
	{
		log_failed_hash("Pipeline layout", layout);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}